

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O3

double S2::GetSignedArea(S2PointLoopSpan loop)

{
  _func_double_S2Point_ptr_S2Point_ptr_S2Point_ptr *in_RCX;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  S2PointLoopSpan loop_00;
  S2LogMessage local_20;
  
  loop_00.super_S2PointSpan.ptr_ = (pointer)loop.super_S2PointSpan.len_;
  loop_00.super_S2PointSpan.len_ = (size_type)SignedArea;
  dVar1 = GetSurfaceIntegral<double>((S2 *)loop.super_S2PointSpan.ptr_,loop_00,in_RCX);
  auVar3._8_4_ = loop.super_S2PointSpan.len_._4_4_;
  auVar3._0_8_ = loop_00.super_S2PointSpan.ptr_;
  auVar3._12_4_ = 0x45300000;
  dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)loop.super_S2PointSpan.len_) - 4503599627370496.0)) *
          2.1604940059205547e-15;
  if (dVar4 + 12.566370614359172 < ABS(dVar1)) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
               ,0x7b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_20.stream_,
               "Check failed: (fabs(area)) <= (4 * 3.14159265358979323846 + max_error) ",0x47);
LAB_001ff0f5:
    abort();
  }
  dVar2 = remainder(dVar1,12.566370614359172);
  dVar1 = dVar2;
  if (ABS(dVar2) <= dVar4) {
    dVar4 = GetCurvature(loop);
    if ((((dVar2 == 0.0) && (!NAN(dVar2))) && (dVar4 == 0.0)) && (!NAN(dVar4))) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
                 ,0x83,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_20.stream_,"Check failed: !(area == 0 && curvature == 0) ",0x2d);
      goto LAB_001ff0f5;
    }
    if ((dVar4 != 6.283185307179586) || (dVar1 = 0.0, NAN(dVar4))) {
      if ((0.0 < dVar2) || (dVar4 <= 0.0)) {
        dVar1 = dVar2;
        if ((0.0 <= dVar2) && (dVar4 < 0.0)) {
          dVar1 = -2.2250738585072014e-308;
        }
      }
      else {
        dVar1 = 2.2250738585072014e-308;
      }
    }
  }
  return dVar1;
}

Assistant:

double GetSignedArea(S2PointLoopSpan loop) {
  // It is suprisingly difficult to compute the area of a loop robustly.  The
  // main issues are (1) whether degenerate loops are considered to be CCW or
  // not (i.e., whether their area is close to 0 or 4*Pi), and (2) computing
  // the areas of small loops with good relative accuracy.
  //
  // With respect to degeneracies, we would like GetArea() to be consistent
  // with S2Loop::Contains(S2Point) in that loops that contain many points
  // should have large areas, and loops that contain few points should have
  // small areas.  For example, if a degenerate triangle is considered CCW
  // according to s2pred::Sign(), then it will contain very few points and
  // its area should be approximately zero.  On the other hand if it is
  // considered clockwise, then it will contain virtually all points and so
  // its area should be approximately 4*Pi.
  //
  // More precisely, let U be the set of S2Points for which S2::IsUnitLength()
  // is true, let P(U) be the projection of those points onto the mathematical
  // unit sphere, and let V(P(U)) be the Voronoi diagram of the projected
  // points.  Then for every loop x, we would like GetArea() to approximately
  // equal the sum of the areas of the Voronoi regions of the points p for
  // which x.Contains(p) is true.
  //
  // The second issue is that we want to compute the area of small loops
  // accurately.  This requires having good relative precision rather than
  // good absolute precision.  For example, if the area of a loop is 1e-12 and
  // the error is 1e-15, then the area only has 3 digits of accuracy.  (For
  // reference, 1e-12 is about 40 square meters on the surface of the earth.)
  // We would like to have good relative accuracy even for small loops.
  //
  // To achieve these goals, we combine two different methods of computing the
  // area.  This first method is based on the Gauss-Bonnet theorem, which says
  // that the area enclosed by the loop equals 2*Pi minus the total geodesic
  // curvature of the loop (i.e., the sum of the "turning angles" at all the
  // loop vertices).  The big advantage of this method is that as long as we
  // use s2pred::Sign() to compute the turning angle at each vertex, then
  // degeneracies are always handled correctly.  In other words, if a
  // degenerate loop is CCW according to the symbolic perturbations used by
  // s2pred::Sign(), then its turning angle will be approximately 2*Pi.
  //
  // The disadvantage of the Gauss-Bonnet method is that its absolute error is
  // about 2e-15 times the number of vertices (see GetCurvatureMaxError).
  // So, it cannot compute the area of small loops accurately.
  //
  // The second method is based on splitting the loop into triangles and
  // summing the area of each triangle.  To avoid the difficulty and expense
  // of decomposing the loop into a union of non-overlapping triangles,
  // instead we compute a signed sum over triangles that may overlap (see the
  // comments for S2Loop::GetSurfaceIntegral).  The advantage of this method
  // is that the area of each triangle can be computed with much better
  // relative accuracy (using l'Huilier's theorem).  The disadvantage is that
  // the result is a signed area: CCW loops may yield a small positive value,
  // while CW loops may yield a small negative value (which is converted to a
  // positive area by adding 4*Pi).  This means that small errors in computing
  // the signed area may translate into a very large error in the result (if
  // the sign of the sum is incorrect).
  //
  // So, our strategy is to combine these two methods as follows.  First we
  // compute the area using the "signed sum over triangles" approach (since it
  // is generally more accurate).  We also estimate the maximum error in this
  // result.  If the signed area is too close to zero (i.e., zero is within
  // the error bounds), then we double-check the sign of the result using the
  // Gauss-Bonnet method.  If the two methods disagree, we return the smallest
  // possible positive or negative area based on the result of GetCurvature().
  // Otherwise we return the area that we computed originally.

  // The signed area should be between approximately -4*Pi and 4*Pi.
  // Normalize it to be in the range [-2*Pi, 2*Pi].
  double area = GetSurfaceIntegral(loop, S2::SignedArea);
  double max_error = GetCurvatureMaxError(loop);
  S2_DCHECK_LE(fabs(area), 4 * M_PI + max_error);
  area = remainder(area, 4 * M_PI);

  // If the area is a small negative or positive number, verify that the sign
  // of the result is consistent with the loop orientation.
  if (fabs(area) <= max_error) {
    double curvature = GetCurvature(loop);
    // Zero-area loops should have a curvature of approximately +/- 2*Pi.
    S2_DCHECK(!(area == 0 && curvature == 0));
    if (curvature == 2 * M_PI) return 0.0;  // Degenerate
    if (area <= 0 && curvature > 0) {
      return std::numeric_limits<double>::min();
    }
    // Full loops are handled by the case below.
    if (area >= 0 && curvature < 0) {
      return -std::numeric_limits<double>::min();
    }
  }
  return area;
}